

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall
icu_63::RegexMatcher::refreshInputText(RegexMatcher *this,UText *input,UErrorCode *status)

{
  UBool UVar1;
  int64_t iVar2;
  int64_t iVar3;
  UText *pUVar4;
  int64_t pos;
  UErrorCode *status_local;
  UText *input_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (input == (UText *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      iVar2 = utext_nativeLength_63(this->fInputText);
      iVar3 = utext_nativeLength_63(input);
      if (iVar2 == iVar3) {
        iVar2 = utext_getNativeIndex_63(this->fInputText);
        pUVar4 = utext_clone_63(this->fInputText,input,'\0','\x01',status);
        this->fInputText = pUVar4;
        UVar1 = ::U_FAILURE(*status);
        if ((UVar1 == '\0') &&
           (utext_setNativeIndex_63(this->fInputText,iVar2), this->fAltInputText != (UText *)0x0)) {
          iVar2 = utext_getNativeIndex_63(this->fAltInputText);
          pUVar4 = utext_clone_63(this->fAltInputText,input,'\0','\x01',status);
          this->fAltInputText = pUVar4;
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 == '\0') {
            utext_setNativeIndex_63(this->fAltInputText,iVar2);
          }
        }
      }
      else {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::refreshInputText(UText *input, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (input == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    if (utext_nativeLength(fInputText) != utext_nativeLength(input)) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    int64_t  pos = utext_getNativeIndex(fInputText);
    //  Shallow read-only clone of the new UText into the existing input UText
    fInputText = utext_clone(fInputText, input, FALSE, TRUE, &status);
    if (U_FAILURE(status)) {
        return *this;
    }
    utext_setNativeIndex(fInputText, pos);

    if (fAltInputText != NULL) {
        pos = utext_getNativeIndex(fAltInputText);
        fAltInputText = utext_clone(fAltInputText, input, FALSE, TRUE, &status);
        if (U_FAILURE(status)) {
            return *this;
        }
        utext_setNativeIndex(fAltInputText, pos);
    }
    return *this;
}